

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int pager_truncate(Pager *pPager,Pgno nPage)

{
  sqlite3_io_methods *psVar1;
  i64 iVar2;
  char *__s;
  int iVar3;
  int iVar4;
  i64 newSize;
  i64 currentSize;
  size_t __n;
  
  psVar1 = pPager->fd->pMethods;
  if (psVar1 == (sqlite3_io_methods *)0x0) {
    return 0;
  }
  if (0xfc < (byte)(pPager->eState - 4)) {
    return 0;
  }
  iVar2 = pPager->pageSize;
  iVar3 = (*psVar1->xFileSize)(pPager->fd,&currentSize);
  iVar4 = (int)iVar2;
  __n = (size_t)iVar4;
  newSize = nPage * __n;
  if (iVar3 != 0) {
    return iVar3;
  }
  if (currentSize == newSize) {
    return 0;
  }
  if (newSize < currentSize) {
    iVar3 = (*pPager->fd->pMethods->xTruncate)(pPager->fd,newSize);
  }
  else {
    if (newSize < (long)(currentSize + __n)) goto LAB_0015f629;
    __s = pPager->pTmpSpace;
    memset(__s,0,__n);
    (*pPager->fd->pMethods->xFileControl)(pPager->fd,5,&newSize);
    iVar3 = (*pPager->fd->pMethods->xWrite)(pPager->fd,__s,iVar4,newSize - __n);
  }
  if (iVar3 != 0) {
    return iVar3;
  }
LAB_0015f629:
  pPager->dbFileSize = nPage;
  return 0;
}

Assistant:

static int pager_truncate(Pager *pPager, Pgno nPage){
  int rc = SQLITE_OK;
  assert( pPager->eState!=PAGER_ERROR );
  assert( pPager->eState!=PAGER_READER );

  if( isOpen(pPager->fd)
   && (pPager->eState>=PAGER_WRITER_DBMOD || pPager->eState==PAGER_OPEN)
  ){
    i64 currentSize, newSize;
    int szPage = pPager->pageSize;
    assert( pPager->eLock==EXCLUSIVE_LOCK );
    /* TODO: Is it safe to use Pager.dbFileSize here? */
    rc = sqlite3OsFileSize(pPager->fd, &currentSize);
    newSize = szPage*(i64)nPage;
    if( rc==SQLITE_OK && currentSize!=newSize ){
      if( currentSize>newSize ){
        rc = sqlite3OsTruncate(pPager->fd, newSize);
      }else if( (currentSize+szPage)<=newSize ){
        char *pTmp = pPager->pTmpSpace;
        memset(pTmp, 0, szPage);
        testcase( (newSize-szPage) == currentSize );
        testcase( (newSize-szPage) >  currentSize );
        sqlite3OsFileControlHint(pPager->fd, SQLITE_FCNTL_SIZE_HINT, &newSize);
        rc = sqlite3OsWrite(pPager->fd, pTmp, szPage, newSize-szPage);
      }
      if( rc==SQLITE_OK ){
        pPager->dbFileSize = nPage;
      }
    }
  }
  return rc;
}